

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

UnaryOperator slang::ast::Expression::getUnaryOperator(SyntaxKind kind)

{
  logic_error *this;
  string local_e8;
  allocator<char> local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  SyntaxKind local_10;
  UnaryOperator local_c;
  SyntaxKind kind_local;
  
  switch(kind) {
  case PostdecrementExpression:
    local_c = Postdecrement;
    break;
  case PostincrementExpression:
    local_c = Postincrement;
    break;
  default:
    local_10 = kind;
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/OperatorExpressions.cpp"
               ,&local_b1);
    std::operator+(&local_90,&local_b0,":");
    std::__cxx11::to_string(&local_e8,0x7bc);
    std::operator+(&local_70,&local_90,&local_e8);
    std::operator+(&local_50,&local_70,": ");
    std::operator+(&local_30,&local_50,"Default case should be unreachable!");
    std::logic_error::logic_error(this,(string *)&local_30);
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  case UnaryBitwiseAndExpression:
    local_c = BitwiseAnd;
    break;
  case UnaryBitwiseNandExpression:
    local_c = BitwiseNand;
    break;
  case UnaryBitwiseNorExpression:
    local_c = BitwiseNor;
    break;
  case UnaryBitwiseNotExpression:
    local_c = BitwiseNot;
    break;
  case UnaryBitwiseOrExpression:
    local_c = BitwiseOr;
    break;
  case UnaryBitwiseXnorExpression:
    local_c = BitwiseXnor;
    break;
  case UnaryBitwiseXorExpression:
    local_c = BitwiseXor;
    break;
  case UnaryLogicalNotExpression:
    local_c = LogicalNot;
    break;
  case UnaryMinusExpression:
    local_c = Minus;
    break;
  case UnaryPlusExpression:
    local_c = Plus;
    break;
  case UnaryPredecrementExpression:
    local_c = Predecrement;
    break;
  case UnaryPreincrementExpression:
    local_c = Preincrement;
  }
  return local_c;
}

Assistant:

UnaryOperator Expression::getUnaryOperator(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::UnaryPlusExpression:
            return UnaryOperator::Plus;
        case SyntaxKind::UnaryMinusExpression:
            return UnaryOperator::Minus;
        case SyntaxKind::UnaryBitwiseNotExpression:
            return UnaryOperator::BitwiseNot;
        case SyntaxKind::UnaryBitwiseAndExpression:
            return UnaryOperator::BitwiseAnd;
        case SyntaxKind::UnaryBitwiseOrExpression:
            return UnaryOperator::BitwiseOr;
        case SyntaxKind::UnaryBitwiseXorExpression:
            return UnaryOperator::BitwiseXor;
        case SyntaxKind::UnaryBitwiseNandExpression:
            return UnaryOperator::BitwiseNand;
        case SyntaxKind::UnaryBitwiseNorExpression:
            return UnaryOperator::BitwiseNor;
        case SyntaxKind::UnaryBitwiseXnorExpression:
            return UnaryOperator::BitwiseXnor;
        case SyntaxKind::UnaryLogicalNotExpression:
            return UnaryOperator::LogicalNot;
        case SyntaxKind::UnaryPreincrementExpression:
            return UnaryOperator::Preincrement;
        case SyntaxKind::UnaryPredecrementExpression:
            return UnaryOperator::Predecrement;
        case SyntaxKind::PostincrementExpression:
            return UnaryOperator::Postincrement;
        case SyntaxKind::PostdecrementExpression:
            return UnaryOperator::Postdecrement;
        default:
            ASSUME_UNREACHABLE;
    }
}